

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a078f1::EncodeAPI_Buganizer310766628_Test::~EncodeAPI_Buganizer310766628_Test
          (EncodeAPI_Buganizer310766628_Test *this)

{
  void *in_RDI;
  
  ~EncodeAPI_Buganizer310766628_Test((EncodeAPI_Buganizer310766628_Test *)0x7f97c8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(EncodeAPI, Buganizer310766628) {
  AV1Encoder encoder(7);

  encoder.Configure(16, 759, 383, AOM_CBR, AOM_USAGE_REALTIME);

  // Encode a frame.
  encoder.Encode(false);

  encoder.Configure(2, 759, 383, AOM_VBR, AOM_USAGE_REALTIME);

  // Encode a frame. This will trigger the assertion failure.
  encoder.Encode(false);
}